

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t split(linear_hash_table_t *linear_hash)

{
  ion_byte_t iVar1;
  FILE *pFVar2;
  ion_byte_t *piVar3;
  long lVar4;
  long lVar5;
  undefined8 bucket_loc;
  int iVar6;
  int iVar7;
  ion_status_t iVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  ion_byte_t *__s;
  ion_byte_t *__dest;
  uint uVar12;
  ulong uVar13;
  ion_byte_t *key;
  ion_byte_t aiStack_80 [8];
  undefined8 local_78;
  long local_70;
  long local_68;
  undefined1 local_60 [8];
  linear_hash_bucket_t bucket;
  long local_40;
  
  if (linear_hash->next_split < linear_hash->bucket_map->current_size) {
    local_40 = linear_hash->bucket_map->data[linear_hash->next_split];
  }
  else {
    local_40 = -1;
  }
  aiStack_80[0] = 0xe7;
  aiStack_80[1] = 0xb5;
  aiStack_80[2] = '\x10';
  aiStack_80[3] = '\0';
  aiStack_80[4] = '\0';
  aiStack_80[5] = '\0';
  aiStack_80[6] = '\0';
  aiStack_80[7] = '\0';
  iVar8.error = linear_hash_get_bucket(local_40,(linear_hash_bucket_t *)local_60,linear_hash);
  iVar8._1_7_ = 0;
  if (iVar8.error == 0) {
    key = (ion_byte_t *)
          ((long)&local_78 -
          ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0));
    lVar4 = -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    __dest = key + lVar4;
    sVar11 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    lVar5 = -(sVar11 + 0xf & 0xfffffffffffffff0);
    __s = __dest + lVar5;
    __s[-8] = 'I';
    __s[-7] = 0xb6;
    __s[-6] = '\x10';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    memset(__s,0,sVar11);
    do {
      iVar6 = local_60._4_4_;
      if (0 < (int)local_60._4_4_) {
        pFVar2 = (FILE *)linear_hash->database;
        local_68 = local_40 + 0x10;
        __s[-8] = 'p';
        __s[-7] = 0xb6;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        fseek(pFVar2,local_40 + 0x10,0);
        iVar7 = linear_hash->records_per_bucket;
        sVar11 = linear_hash->record_total_size;
        pFVar2 = (FILE *)linear_hash->database;
        __s[-8] = 0x85;
        __s[-7] = 0xb6;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        fread(__s,sVar11,(long)iVar7,pFVar2);
        lVar10 = 0;
        uVar13 = 0;
        while ((int)uVar13 < iVar6) {
          iVar1 = (__s + lVar10 + 1)[-1];
          sVar11 = (size_t)(linear_hash->super).record.key_size;
          local_78 = uVar13;
          local_70 = lVar10;
          bucket.overflow_location._4_4_ = iVar6;
          __s[-8] = 0xbe;
          __s[-7] = 0xb6;
          __s[-6] = '\x10';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          memcpy(key,__s + lVar10 + 1,sVar11);
          iVar6 = (linear_hash->super).record.value_size;
          builtin_memcpy(key + lVar5 + lVar4 + -8,"Ѷ\x10",4);
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          memcpy(__dest,__s + sVar11 + lVar10 + 1,(long)iVar6);
          builtin_memcpy(key + lVar5 + lVar4 + -8,"ܶ\x10",4);
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar6 = insert_hash_to_bucket(key,linear_hash);
          __s[-8] = 0xea;
          __s[-7] = 0xb6;
          __s[-6] = '\x10';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar7 = hash_to_bucket(key,linear_hash);
          if ((iVar1 == '\x01') && (iVar6 != iVar7)) {
            __s[-8] = '\0';
            __s[-7] = 0xb7;
            __s[-6] = '\x10';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            iVar8 = linear_hash_delete(key,linear_hash);
            if (iVar8.error != '\0') goto LAB_0010b5eb;
            linear_hash->last_cache_idx = 0;
            iVar6 = iVar8.count;
            if (iVar6 == 0 || (long)iVar8 < 0) {
              iVar6 = 0;
            }
            iVar6 = iVar6 + 1;
            while (lVar10 = local_68, iVar6 = iVar6 + -1, iVar6 != 0) {
              iVar7 = linear_hash->last_cache_idx;
              sVar11 = (size_t)(linear_hash->super).record.value_size;
              piVar3 = linear_hash->cache;
              __s[-8] = '?';
              __s[-7] = 0xb7;
              __s[-6] = '\x10';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              memcpy(__dest,piVar3 + (long)iVar7 * sVar11,sVar11);
              linear_hash->last_cache_idx = iVar7 + 1;
              __s[-8] = 'Q';
              __s[-7] = 0xb7;
              __s[-6] = '\x10';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              iVar7 = hash_to_bucket(key,linear_hash);
              __s[-8] = 'a';
              __s[-7] = 0xb7;
              __s[-6] = '\x10';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              iVar8 = linear_hash_insert(key,__dest,iVar7,linear_hash);
              if (iVar8.error != '\0') goto LAB_0010b5eb;
            }
            pFVar2 = (FILE *)linear_hash->database;
            uVar12 = 0;
            __s[-8] = 0x91;
            __s[-7] = 0xb7;
            __s[-6] = '\x10';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            fseek(pFVar2,lVar10,0);
            iVar6 = linear_hash->records_per_bucket;
            sVar11 = linear_hash->record_total_size;
            pFVar2 = (FILE *)linear_hash->database;
            __s[-8] = 0xa6;
            __s[-7] = 0xb7;
            __s[-6] = '\x10';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            fread(__s,sVar11,(long)iVar6,pFVar2);
            __s[-8] = 0xb6;
            __s[-7] = 0xb7;
            __s[-6] = '\x10';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            linear_hash_get_bucket(local_40,(linear_hash_bucket_t *)local_60,linear_hash);
            lVar9 = linear_hash->record_total_size;
            lVar10 = -lVar9;
            iVar6 = local_60._4_4_;
          }
          else {
            lVar9 = linear_hash->record_total_size;
            uVar12 = (int)local_78 + 1;
            lVar10 = local_70;
            iVar6 = bucket.overflow_location._4_4_;
          }
          lVar10 = lVar10 + lVar9;
          uVar13 = (ulong)uVar12;
        }
      }
      bucket_loc = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        linear_hash->next_split = linear_hash->next_split + 1;
        iVar8.error = '\0';
        iVar8._1_3_ = 0;
        iVar8.count = 0;
        break;
      }
      local_40._0_4_ = bucket.idx;
      local_40._4_4_ = bucket.record_count;
      __s[-8] = 0xe6;
      __s[-7] = 0xb7;
      __s[-6] = '\x10';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      iVar8.error = linear_hash_get_bucket(bucket_loc,(linear_hash_bucket_t *)local_60,linear_hash);
      iVar8._1_7_ = 0;
    } while (iVar8.error == 0);
  }
LAB_0010b5eb:
  return iVar8.error;
}

Assistant:

ion_err_t
split(
	linear_hash_table_t *linear_hash
) {
	/* status to hold amount of records deleted */
	ion_status_t status					= ION_STATUS_INITIALIZE;

	/* get bucket to split */
	ion_fpos_t				bucket_loc	= bucket_idx_to_ion_fpos_t(linear_hash->next_split, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status.error;
	}

	/* stores for record data */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int split_hash_key;
	int insert_hash_key;

	int			i, j;
	ion_byte_t	*records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false) {
		/* if the bucket is not empty */
		if (bucket.record_count > 0) {
			/* read all records into memory */
			fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
			fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

			/* scan records for records that should be placed in the new bucket */
			for (i = 0; i < bucket.record_count; i++) {
				memcpy(&record_status, records + record_offset, sizeof(record_status));
				memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
				memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

				insert_hash_key = insert_hash_to_bucket(record_key, linear_hash);

				split_hash_key	= hash_to_bucket(record_key, linear_hash);

				/* if the record is not a tombstone and h0(k) != h1(k) */
				if ((record_status == linear_hash_record_status_full) && (insert_hash_key != split_hash_key)) {
					/* delete all records with this key from the table */
					status = linear_hash_delete(record_key, linear_hash);

					if (status.error != err_ok) {
						return status.error;
					}

					int num_deleted = status.count;

					linear_hash->last_cache_idx = 0;

					/* insert that many records into the table */
					for (j = 0; j < num_deleted; j++) {
						memcpy(record_value, linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						status = linear_hash_insert(record_key, record_value, hash_to_bucket(record_key, linear_hash), linear_hash);

						if (status.error != err_ok) {
							return status.error;
						}
					}

					/* refresh cached data and restart iteration and offset tracker */
					fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
					fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);
					status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
					i				= -1;
					record_offset	= -1 * linear_hash->record_total_size;
				}

				/* track offset from locations of records in memory the next record is at */
				record_offset += linear_hash->record_total_size;
			}

			/* reset offset */
			record_offset = 0;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status.error;
			}
		}
	}

	return linear_hash_increment_next_split(linear_hash);
}